

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall Catch::JunitReporter::writeTestCase(JunitReporter *this,TestCaseNode *testCaseNode)

{
  SectionNode *sectionNode;
  TestCaseInfo *pTVar1;
  pointer pTVar2;
  int iVar3;
  pointer pTVar4;
  undefined4 extraout_var;
  ulong uVar5;
  long lVar6;
  long extraout_RDX;
  char *pcVar7;
  long lVar8;
  string local_c8;
  string className;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  StringRef local_40;
  
  sectionNode = ((testCaseNode->children).
                 super__Vector_base<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->m_ptr;
  StringRef::operator_cast_to_string(&className,&((testCaseNode->value).testInfo)->className);
  if (className._M_string_length != 0) goto LAB_00148cec;
  pTVar1 = (testCaseNode->value).testInfo;
  pTVar4 = (pTVar1->tags).super__Vector_base<Catch::Tag,_std::allocator<Catch::Tag>_>._M_impl.
           super__Vector_impl_data._M_start;
  pTVar2 = (pTVar1->tags).super__Vector_base<Catch::Tag,_std::allocator<Catch::Tag>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar6 = (long)pTVar2 - (long)pTVar4;
  for (lVar8 = lVar6 >> 6; 0 < lVar8; lVar8 = lVar8 + -1) {
    if (((pTVar4->original).m_size != 0) && (pcVar7 = (pTVar4->original).m_start, *pcVar7 == '#'))
    goto LAB_00148c69;
    if ((pTVar4[1].original.m_size != 0) && (pcVar7 = pTVar4[1].original.m_start, *pcVar7 == '#')) {
      pTVar4 = pTVar4 + 1;
      goto LAB_00148c69;
    }
    if ((pTVar4[2].original.m_size != 0) && (pcVar7 = pTVar4[2].original.m_start, *pcVar7 == '#')) {
      pTVar4 = pTVar4 + 2;
      goto LAB_00148c69;
    }
    if ((pTVar4[3].original.m_size != 0) && (pcVar7 = pTVar4[3].original.m_start, *pcVar7 == '#')) {
      pTVar4 = pTVar4 + 3;
      goto LAB_00148c69;
    }
    pTVar4 = pTVar4 + 4;
    lVar6 = lVar6 + -0x40;
  }
  lVar6 = lVar6 >> 4;
  if (lVar6 == 1) {
LAB_00148c48:
    if (((pTVar4->original).m_size != 0) && (pcVar7 = (pTVar4->original).m_start, *pcVar7 == '#'))
    goto LAB_00148c69;
LAB_00148ca6:
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    local_c8._M_string_length = 0;
    local_c8.field_2._M_local_buf[0] = '\0';
  }
  else {
    if (lVar6 == 2) {
LAB_00148c35:
      if (((pTVar4->original).m_size == 0) || (pcVar7 = (pTVar4->original).m_start, *pcVar7 != '#'))
      {
        pTVar4 = pTVar4 + 1;
        goto LAB_00148c48;
      }
    }
    else {
      if (lVar6 != 3) goto LAB_00148ca6;
      if (((pTVar4->original).m_size == 0) || (pcVar7 = (pTVar4->original).m_start, *pcVar7 != '#'))
      {
        pTVar4 = pTVar4 + 1;
        goto LAB_00148c35;
      }
    }
LAB_00148c69:
    if (pTVar4 == pTVar2) goto LAB_00148ca6;
    uVar5 = (pTVar4->original).m_size;
    local_80._M_dataplus._M_p = "";
    if (1 < uVar5) {
      local_80._M_dataplus._M_p = pcVar7 + 1;
    }
    local_80._M_string_length = 0;
    if (uVar5 != 0) {
      local_80._M_string_length = uVar5 - 1;
    }
    StringRef::operator_cast_to_string(&local_c8,(StringRef *)&local_80);
  }
  std::__cxx11::string::operator=((string *)&className,(string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  if (className._M_string_length == 0) {
    std::__cxx11::string::assign((char *)&className);
  }
LAB_00148cec:
  (*((this->super_CumulativeReporterBase).super_ReporterBase.super_IEventListener.m_config)->
    _vptr_IConfig[3])();
  if (extraout_RDX != 0) {
    iVar3 = (*((this->super_CumulativeReporterBase).super_ReporterBase.super_IEventListener.m_config
              )->_vptr_IConfig[3])();
    local_40.m_start = (char *)CONCAT44(extraout_var,iVar3);
    StringRef::operator_cast_to_string(&local_60,&local_40);
    std::operator+(&local_80,&local_60,'.');
    std::operator+(&local_c8,&local_80,&className);
    std::__cxx11::string::operator=((string *)&className,(string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_60);
  }
  while (uVar5 = std::__cxx11::string::find((char *)&className,0x166889),
        uVar5 != 0xffffffffffffffff) {
    std::__cxx11::string::replace((ulong)&className,uVar5,(char *)0x2);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"",(allocator<char> *)&local_80);
  writeSection(this,&className,&local_c8,sectionNode,
               (((testCaseNode->value).testInfo)->properties & (MayFail|ShouldFail)) != None);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&className);
  return;
}

Assistant:

void JunitReporter::writeTestCase( TestCaseNode const& testCaseNode ) {
        TestCaseStats const& stats = testCaseNode.value;

        // All test cases have exactly one section - which represents the
        // test case itself. That section may have 0-n nested sections
        assert( testCaseNode.children.size() == 1 );
        SectionNode const& rootSection = *testCaseNode.children.front();

        std::string className =
            static_cast<std::string>( stats.testInfo->className );

        if( className.empty() ) {
            className = fileNameTag(stats.testInfo->tags);
            if ( className.empty() ) {
                className = "global";
            }
        }

        if ( !m_config->name().empty() )
            className = static_cast<std::string>(m_config->name()) + '.' + className;

        normalizeNamespaceMarkers(className);

        writeSection( className, "", rootSection, stats.testInfo->okToFail() );
    }